

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
reserve(InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
        *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar4;
  int i;
  ulong uVar5;
  anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
  *paVar6;
  Point3<float> *pPVar3;
  
  if (this->ptr == (Point3<float> *)0x0) {
    uVar5 = 0x10;
  }
  else {
    uVar5 = this->nAlloc;
  }
  if (uVar5 < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 0xc,4);
    pPVar3 = (Point3<float> *)CONCAT44(extraout_var,iVar2);
    lVar4 = 0;
    for (uVar5 = 0; uVar5 < this->nStored; uVar5 = uVar5 + 1) {
      paVar6 = (anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
                *)this->ptr;
      if ((anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
           *)this->ptr ==
          (anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
           *)0x0) {
        paVar6 = &this->field_2;
      }
      *(undefined4 *)((long)&(pPVar3->super_Tuple3<pbrt::Point3,_float>).z + lVar4) =
           *(undefined4 *)((long)paVar6 + lVar4 + 8);
      *(undefined8 *)((long)&(pPVar3->super_Tuple3<pbrt::Point3,_float>).x + lVar4) =
           *(undefined8 *)((long)paVar6 + lVar4);
      lVar4 = lVar4 + 0xc;
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0xc,4);
    this->nAlloc = n;
    this->ptr = pPVar3;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }